

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O1

void __thiscall
trun::ResultsReportJSON::PrintFailures
          (ResultsReportJSON *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  pointer psVar4;
  Ref local_40;
  
  if ((this->bHadSuccess != false) || (this->bHadSummary == true)) {
    fwrite(",\n",2,1,(FILE *)(this->super_ResultsReportPinterBase).fout);
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Failures\":[");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  psVar4 = (results->
           super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (results->
           super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    bVar3 = false;
    do {
      peVar2 = (psVar4->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar4->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar2->testResult != kTestResult_Pass) {
        if (bVar3) {
          ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_40.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
        local_40.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = this_00;
        PrintTestResult(this,&local_40);
        bVar3 = true;
        if (local_40.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"");
  ResultsReportPinterBase::Write(&this->super_ResultsReportPinterBase,"]");
  this->bHadFailures = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintFailures(const std::vector<TestResult::Ref > &results) {
    if (bHadSuccess || bHadSummary) {
        fprintf(fout,",\n");
    }

    WriteLine("\"Failures\":[");
    PushIndent();
    bool bNeedComma = false;

    for (auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            if (bNeedComma) {
                WriteNoIndent(",\n");
            }
            PrintTestResult(r);
            bNeedComma = true;
        }
    }
    PopIndent();
    WriteLine("");
    Write("]");
    bHadFailures = true;
}